

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  undefined8 uVar1;
  Result RVar2;
  TokenType TVar3;
  Result RVar4;
  undefined1 auVar5 [8];
  _func_int **pp_Var6;
  pointer *__ptr;
  long *plVar7;
  long lVar8;
  string_view name_00;
  __single_object import;
  __single_object import_1;
  string name;
  Location loc;
  string field_name;
  string module_name;
  undefined1 local_128 [8];
  undefined1 local_120 [32];
  long *local_100 [2];
  long local_f0 [2];
  undefined1 local_e0 [4];
  Enum local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  undefined8 uStack_a0;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  anon_union_16_2_ecfd7102_for_Location_1 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_120,this);
  local_a8.offset = local_120._16_8_;
  uStack_a0 = local_120._24_8_;
  local_b8 = (TagImport *)local_120._0_8_;
  uStack_b0 = local_120._8_8_;
  CheckImportOrdering(this,module);
  RVar2 = Expect(this,Import);
  RVar4.enum_ = Error;
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._8_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_88.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)&local_78;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  RVar2 = ParseQuotedText(this,&local_68,true);
  if (RVar2.enum_ == Error) goto LAB_0013ce41;
  RVar4.enum_ = Error;
  RVar2 = ParseQuotedText(this,(string *)&local_88.field_0,true);
  if ((RVar2.enum_ == Error) || (RVar2 = Expect(this,Lpar), RVar2.enum_ == Error))
  goto LAB_0013ce41;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  local_d8._8_8_ = 0;
  local_c8._M_local_buf[0] = '\0';
  TVar3 = Peek(this,0);
  if ((int)TVar3 < 0x1f) {
    if (TVar3 == Tag) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,(string *)&local_d8);
      auVar5 = (undefined1  [8])operator_new(0xf0);
      name_00._M_str = (char *)local_d8._M_allocated_capacity;
      name_00._M_len = local_d8._8_8_;
      TagImport::TagImport((TagImport *)auVar5,name_00);
      RVar2 = ParseTypeUseOpt(this,&(((TagImport *)auVar5)->tag).decl);
      if (((RVar2.enum_ != Error) &&
          (RVar2 = ParseUnboundFuncSignature(this,&(((TagImport *)auVar5)->tag).decl.sig),
          RVar2.enum_ != Error)) && (RVar2 = Expect(this,Rpar), RVar2.enum_ != Error)) {
        local_90._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        *(long *)((long)local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(undefined ***)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ModuleField_001a3a50;
        *(TagImport **)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             local_b8;
        *(size_type *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) =
             uStack_b0;
        *(size_t *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) =
             local_a8.offset;
        *(long *)((long)local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30
                 ) = uStack_a0;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_001a4288;
        *(undefined1 (*) [8])
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             auVar5;
        goto LAB_0013cf7a;
      }
      pp_Var6 = (((TagImport *)auVar5)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
                _vptr_Import;
LAB_0013ce1d:
      (*pp_Var6[1])(auVar5);
      goto LAB_0013ce20;
    }
    if (TVar3 == Global) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,(string *)&local_d8);
      std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar2 = ParseGlobalType(this,(Global *)(local_120._0_8_ + 0x50));
LAB_0013cbf0:
      auVar5 = (undefined1  [8])local_120._0_8_;
      if ((RVar2.enum_ != Error) &&
         (RVar2 = Expect(this,Rpar), auVar5 = (undefined1  [8])local_120._0_8_, RVar2.enum_ != Error
         )) goto LAB_0013cc0f;
      goto LAB_0013cd91;
    }
LAB_0013ce8f:
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"an external kind","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (string *)local_120);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((TagImport *)local_120._0_8_ != (TagImport *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
  }
  else if (TVar3 == Memory) {
    Consume((Token *)local_120,this);
    ParseBindVarOpt(this,(string *)&local_d8);
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    (((anon_union_16_2_ecfd7102_for_Location_1 *)(local_120._0_8_ + 0x88))->field_0).line = 0x10000;
    RVar2 = ParseLimitsIndex(this,(Limits *)(local_120._0_8_ + 0x70));
    if ((((RVar2.enum_ == Error) ||
         (RVar2 = ParseLimits(this,(Limits *)(local_120._0_8_ + 0x70)), RVar2.enum_ == Error)) ||
        (RVar2 = ParsePageSize(this,(uint32_t *)(local_120._0_8_ + 0x88)), RVar2.enum_ == Error)) ||
       (RVar2 = Expect(this,Rpar), RVar2.enum_ == Error)) {
      if ((TagImport *)local_120._0_8_ != (TagImport *)0x0) {
        (**(code **)(*(long *)local_120._0_8_ + 8))();
      }
      RVar4.enum_ = Error;
    }
    else {
LAB_0013cc0f:
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      uVar1 = local_120._0_8_;
      local_120._0_8_ = (TagImport *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
           (_func_int **)&PTR__ModuleField_001a3a50;
      *(undefined4 *)
       &(((ImportModuleField *)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_len =
           (undefined4)local_b8;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
               _M_len + 4) = local_b8._4_4_;
      *(undefined4 *)
       &(((ImportModuleField *)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_str =
           (undefined4)uStack_b0;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
               _M_str + 4) = uStack_b0._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.line =
           (int)local_a8.offset;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
      first_column = local_a8.offset._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
      last_column = (int)uStack_a0;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1 + 0xc
       ) = uStack_a0._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.type_ = Import;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
           (_func_int **)&PTR__ImportModuleField_001a4288;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = (Import *)uVar1;
LAB_0013cf7a:
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 8));
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 0x28));
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_90);
      if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           )local_90._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
          (ImportModuleField *)0x0) {
        (**(code **)(*(long *)local_90._M_t.
                              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl
                    + 8))();
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            )0x0;
      RVar2 = Expect(this,Rpar);
      RVar4.enum_ = (Enum)(RVar2.enum_ == Error);
    }
  }
  else {
    if (TVar3 == Table) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,(string *)&local_d8);
      std::make_unique<wabt::TableImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar2 = ParseLimitsIndex(this,(Limits *)(local_120._0_8_ + 0x70));
      auVar5 = (undefined1  [8])local_120._0_8_;
      if ((RVar2.enum_ != Error) &&
         (RVar2 = ParseLimits(this,(Limits *)(local_120._0_8_ + 0x70)),
         auVar5 = (undefined1  [8])local_120._0_8_, RVar2.enum_ != Error)) {
        RVar2 = ParseRefType(this,(Type *)(local_120._0_8_ + 0x88));
        goto LAB_0013cbf0;
      }
    }
    else {
      if (TVar3 != First_RefKind) goto LAB_0013ce8f;
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,(string *)&local_d8);
      std::make_unique<wabt::FuncImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      RVar2 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)local_128 + 0x70));
      auVar5 = local_128;
      if ((RVar2.enum_ != Error) &&
         (RVar2 = ParseFuncSignature(this,(FuncSignature *)((long)local_128 + 0xc0),
                                     (BindingHash *)((long)local_128 + 0x108)), auVar5 = local_128,
         RVar2.enum_ != Error)) {
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"param","");
        plVar7 = local_f0;
        local_100[0] = plVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"result","");
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   local_120,local_e0);
        local_dc = (Enum)ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        lVar8 = -0x40;
        do {
          if (plVar7 != (long *)plVar7[-2]) {
            operator_delete((long *)plVar7[-2],*plVar7 + 1);
          }
          plVar7 = plVar7 + -4;
          lVar8 = lVar8 + 0x20;
        } while (lVar8 != 0);
        auVar5 = local_128;
        if ((local_dc != Error) &&
           (RVar2 = Expect(this,Rpar), auVar5 = local_128, RVar2.enum_ != Error)) {
          local_90._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
               (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
               operator_new(0x48);
          auVar5 = local_128;
          local_128 = (undefined1  [8])0x0;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
          super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
          super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
               (_func_int **)&PTR__ModuleField_001a3a50;
          *(undefined4 *)
           &(((ImportModuleField *)
             local_90._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_len
               = (undefined4)local_b8;
          *(undefined4 *)
           ((long)&(((ImportModuleField *)
                    local_90._M_t.
                    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
                   _M_len + 4) = local_b8._4_4_;
          *(undefined4 *)
           &(((ImportModuleField *)
             local_90._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_str
               = (undefined4)uStack_b0;
          *(undefined4 *)
           ((long)&(((ImportModuleField *)
                    local_90._M_t.
                    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
                   _M_str + 4) = uStack_b0._4_4_;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
          line = (int)local_a8.offset;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
          first_column = local_a8.offset._4_4_;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
          last_column = (int)uStack_a0;
          *(undefined4 *)
           ((long)&(((ImportModuleField *)
                    local_90._M_t.
                    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1 +
           0xc) = uStack_a0._4_4_;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.type_ = Import;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
               (_func_int **)&PTR__ImportModuleField_001a4288;
          (((ImportModuleField *)
           local_90._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
          super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
          super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = (Import *)auVar5;
          goto LAB_0013cf7a;
        }
      }
    }
LAB_0013cd91:
    if (auVar5 != (undefined1  [8])0x0) {
      pp_Var6 = (((TagImport *)auVar5)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
                _vptr_Import;
      goto LAB_0013ce1d;
    }
LAB_0013ce20:
    RVar4.enum_ = Error;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
LAB_0013ce41:
  if (local_88.field_1.offset !=
      (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)&local_78) {
    operator_delete((void *)local_88.field_1.offset,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<FuncImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
      CHECK_RESULT(
          ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
      CHECK_RESULT(ErrorIfLpar({"param", "result"}));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TableImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<MemoryImport>(name);
      import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&import->memory.page_size));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Tag: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TagImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->tag.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->tag.decl.sig));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}